

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_publickey_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase)

{
  int iVar1;
  time_t start_time;
  char *passphrase_00;
  uchar *pubkeydata;
  size_t pubkeydata_len;
  privkey_file privkey_file;
  uchar *local_80;
  size_t local_78;
  size_t *local_70;
  uchar **local_68;
  char *local_60;
  ulong local_58;
  char *local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  
  passphrase_00 = "";
  if (passphrase != (char *)0x0) {
    passphrase_00 = passphrase;
  }
  local_60 = publickey;
  local_50 = user;
  start_time = time((time_t *)0x0);
  local_58 = (ulong)user_len;
  local_68 = &session->userauth_pblc_method;
  local_70 = &session->userauth_pblc_method_len;
  do {
    local_80 = (uchar *)0x0;
    local_78 = 0;
    local_48 = &local_40;
    local_40 = privatekey;
    local_38 = passphrase_00;
    if (session->userauth_pblc_state == libssh2_NB_state_idle) {
      if (local_60 == (char *)0x0) {
        iVar1 = _libssh2_pub_priv_keyfile
                          (session,local_68,local_70,&local_80,&local_78,privatekey,passphrase_00);
      }
      else {
        iVar1 = file_read_publickey(session,local_68,local_70,&local_80,&local_78,local_60);
      }
      if (iVar1 == 0) goto LAB_0011699c;
    }
    else {
LAB_0011699c:
      iVar1 = _libssh2_userauth_publickey
                        (session,local_50,local_58,local_80,local_78,sign_fromfile,&local_48);
      if (local_80 != (uchar *)0x0) {
        (*session->free)(local_80,&session->abstract);
      }
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase)
{
    int rc;

    if(!passphrase)
        /* if given a NULL pointer, make it point to a zero-length
           string to save us from having to check this all over */
        passphrase = "";

    BLOCK_ADJUST(rc, session,
                 userauth_publickey_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase));
    return rc;
}